

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O1

Grammar * __thiscall
xercesc_4_0::GrammarResolver::orphanGrammar(GrammarResolver *this,XMLCh *nameSpaceKey)

{
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  Grammar *pGVar5;
  XMLCh *pXVar6;
  XMLCh XVar7;
  RefHashTableBucketElem<xercesc_4_0::Grammar> *pRVar8;
  
  if (this->fCacheGrammar != true) {
LAB_002f4a59:
    pGVar5 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::orphanKey
                       (this->fGrammarBucket,nameSpaceKey);
    return pGVar5;
  }
  iVar3 = (*this->fGrammarPool->_vptr_XMLGrammarPool[4])(this->fGrammarPool,nameSpaceKey);
  pGVar5 = (Grammar *)CONCAT44(extraout_var,iVar3);
  if (pGVar5 == (Grammar *)0x0) {
    pRVar1 = this->fGrammarBucket;
    if ((nameSpaceKey == (XMLCh *)0x0) || (uVar4 = (ulong)(ushort)*nameSpaceKey, uVar4 == 0)) {
      uVar4 = 0;
    }
    else {
      XVar7 = nameSpaceKey[1];
      if (XVar7 != L'\0') {
        pXVar6 = nameSpaceKey + 2;
        do {
          uVar4 = (ulong)(ushort)XVar7 + (uVar4 >> 0x18) + uVar4 * 0x26;
          XVar7 = *pXVar6;
          pXVar6 = pXVar6 + 1;
        } while (XVar7 != L'\0');
      }
      uVar4 = uVar4 % pRVar1->fHashModulus;
    }
    pRVar8 = pRVar1->fBucketList[uVar4];
    if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) {
      do {
        bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,nameSpaceKey,pRVar8->fKey);
        if (bVar2) goto LAB_002f4a59;
        pRVar8 = pRVar8->fNext;
      } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0);
      if (bVar2) goto LAB_002f4a59;
    }
    pGVar5 = (Grammar *)0x0;
  }
  else {
    pRVar1 = this->fGrammarFromPool;
    if ((nameSpaceKey == (XMLCh *)0x0) || (uVar4 = (ulong)(ushort)*nameSpaceKey, uVar4 == 0)) {
      uVar4 = 0;
    }
    else {
      XVar7 = nameSpaceKey[1];
      if (XVar7 != L'\0') {
        pXVar6 = nameSpaceKey + 2;
        do {
          uVar4 = (ulong)(ushort)XVar7 + (uVar4 >> 0x18) + uVar4 * 0x26;
          XVar7 = *pXVar6;
          pXVar6 = pXVar6 + 1;
        } while (XVar7 != L'\0');
      }
      uVar4 = uVar4 % pRVar1->fHashModulus;
    }
    pRVar8 = pRVar1->fBucketList[uVar4];
    if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) {
      do {
        bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,nameSpaceKey,pRVar8->fKey);
        if (bVar2) goto LAB_002f4a10;
        pRVar8 = pRVar8->fNext;
      } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0);
      if (bVar2) {
LAB_002f4a10:
        RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::removeKey
                  (this->fGrammarFromPool,nameSpaceKey);
      }
    }
  }
  return pGVar5;
}

Assistant:

Grammar* GrammarResolver::orphanGrammar(const XMLCh* const nameSpaceKey)
{
    if (fCacheGrammar)
    {
        Grammar* grammar = fGrammarPool->orphanGrammar(nameSpaceKey);
        if (grammar)
        {
            if (fGrammarFromPool->containsKey(nameSpaceKey))
                fGrammarFromPool->removeKey(nameSpaceKey);
        }
        // Check to see if it's in fGrammarBucket, since
        // we put it there if the grammar pool refused to
        // cache it.
        else if (fGrammarBucket->containsKey(nameSpaceKey))
        {
            grammar = fGrammarBucket->orphanKey(nameSpaceKey);
        }

        return grammar;
    }
    else
    {
        return fGrammarBucket->orphanKey(nameSpaceKey);
    }
}